

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

void __thiscall MPEGSequenceHeader::setFrameRate(MPEGSequenceHeader *this,uint8_t *buff,double fps)

{
  ostream *poVar1;
  VodCoreException *this_00;
  MPEGSequenceHeader *pMVar2;
  double extraout_XMM0_Qa;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream ss;
  byte local_21;
  uint8_t i;
  double fps_local;
  uint8_t *buff_local;
  MPEGSequenceHeader *this_local;
  
  local_21 = 1;
  pMVar2 = this;
  while( true ) {
    if (8 < local_21) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar1 = std::operator<<((ostream *)local_1a0,"Can\'t set fps to value ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fps);
      std::operator<<(poVar1,". Only standard fps values allowed for mpeg2 streams.");
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,0x15e,&local_1d0);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    std::abs((int)pMVar2);
    if (extraout_XMM0_Qa < 3e-05) break;
    local_21 = local_21 + 1;
  }
  this->frame_rate_index = local_21;
  buff[3] = (buff[3] & 0xf0) + local_21;
  return;
}

Assistant:

void MPEGSequenceHeader::setFrameRate(uint8_t* buff, const double fps)
{
    for (uint8_t i = 1; i < 9; i++)
        if (std::abs(frame_rates[i] - fps) < FRAME_RATE_EPS)
        {
            frame_rate_index = i;
            buff[3] = (buff[3] & 0xf0) + i;
            return;
        }
    THROW(ERR_MPEG2_ERR_FPS,
          "Can't set fps to value " << fps << ". Only standard fps values allowed for mpeg2 streams.")
}